

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_signal.cpp
# Opt level: O0

void tst_signal_basic(void)

{
  __type _Var1;
  ostream *poVar2;
  socklen_t in_ECX;
  socklen_t __len;
  _Invoker_type p_Var3;
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  local_260;
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  signal_string_float_float;
  undefined1 local_238 [8];
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  stringFloatFloatCFunc;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
  local_1f0;
  undefined1 local_1d0 [8];
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  stringFloatFloatLambda;
  float emitted_float2;
  float emitted_float1;
  string emitted_string;
  Signal<int> local_180;
  Signal<int> signal_int;
  undefined1 local_158 [8];
  SignalHandler_Function<int> intCFunc;
  function<void_(int)> local_120;
  undefined1 local_100 [8];
  SignalHandler_Function<int> intLambda;
  int emitted_int;
  Signal<> signal_void;
  undefined1 local_a8 [8];
  SignalHandler_Function<> voidCFunc;
  anon_class_8_1_249fb376 local_70;
  function<void_()> local_68;
  undefined1 local_48 [8];
  SignalHandler_Function<> voidLambda;
  SignalEmitter emitter;
  bool called_string_float_float;
  bool called_int;
  bool called_void;
  
  emitter.m_buckets._7_1_ = 0;
  emitter.m_buckets._6_1_ = 0;
  emitter.m_buckets._5_1_ = 0;
  rengine::SignalEmitter::SignalEmitter((SignalEmitter *)&voidLambda.m_handler._M_invoker);
  local_70.called_void = (bool *)((long)&emitter.m_buckets + 7);
  std::function<void()>::function<tst_signal_basic()::__0,void>
            ((function<void()> *)&local_68,&local_70);
  rengine::SignalHandler_Function<>::SignalHandler_Function
            ((SignalHandler_Function<> *)local_48,&local_68);
  std::function<void_()>::~function(&local_68);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&signal_void,cfunc_void);
  rengine::SignalHandler_Function<>::SignalHandler_Function
            ((SignalHandler_Function<> *)local_a8,(function<void_()> *)&signal_void);
  std::function<void_()>::~function((function<void_()> *)&signal_void);
  rengine::Signal<>::Signal((Signal<> *)&stack0xffffffffffffff30);
  rengine::Signal<>::connect
            ((Signal<> *)&stack0xffffffffffffff30,(int)&voidLambda + 0x20,(sockaddr *)local_48,
             in_ECX);
  rengine::Signal<>::connect
            ((Signal<> *)&stack0xffffffffffffff30,(int)&voidLambda + 0x20,(sockaddr *)local_a8,
             in_ECX);
  rengine::Signal<>::emit
            ((Signal<> *)&stack0xffffffffffffff30,(SignalEmitter *)&voidLambda.m_handler._M_invoker)
  ;
  if (((cfunc_void_called & 1U) == 0) && ((cfunc_void_called & 1U) == 0)) {
    __assert_fail("cfunc_void_called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x2c,"void tst_signal_basic()");
  }
  if (((emitter.m_buckets._7_1_ & 1) == 0) && ((emitter.m_buckets._7_1_ & 1) == 0)) {
    __assert_fail("called_void",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x2d,"void tst_signal_basic()");
  }
  rengine::Signal<>::disconnect
            ((Signal<> *)&stack0xffffffffffffff30,(SignalEmitter *)&voidLambda.m_handler._M_invoker,
             (SignalHandler<> *)local_a8);
  rengine::Signal<>::disconnect
            ((Signal<> *)&stack0xffffffffffffff30,(SignalEmitter *)&voidLambda.m_handler._M_invoker,
             (SignalHandler<> *)local_48);
  intLambda.m_handler._M_invoker._4_4_ = 0;
  intCFunc.m_handler._M_invoker = (_Invoker_type)((long)&emitter.m_buckets + 6);
  std::function<void(int)>::function<tst_signal_basic()::__1,void>
            ((function<void(int)> *)&local_120,
             (anon_class_16_2_f836bc4e *)&intCFunc.m_handler._M_invoker);
  rengine::SignalHandler_Function<int>::SignalHandler_Function
            ((SignalHandler_Function<int> *)local_100,&local_120);
  std::function<void_(int)>::~function(&local_120);
  std::function<void(int)>::function<void(&)(int),void>
            ((function<void(int)> *)&signal_int,cfunc_int);
  rengine::SignalHandler_Function<int>::SignalHandler_Function
            ((SignalHandler_Function<int> *)local_158,(function<void_(int)> *)&signal_int);
  std::function<void_(int)>::~function((function<void_(int)> *)&signal_int);
  rengine::Signal<int>::Signal(&local_180);
  rengine::Signal<int>::connect(&local_180,(int)&voidLambda + 0x20,(sockaddr *)local_100,in_ECX);
  rengine::Signal<int>::connect(&local_180,(int)&voidLambda + 0x20,(sockaddr *)local_158,in_ECX);
  rengine::Signal<int>::emit(&local_180,(SignalEmitter *)&voidLambda.m_handler._M_invoker,0x2a);
  if (((emitter.m_buckets._6_1_ & 1) == 0) && ((emitter.m_buckets._6_1_ & 1) == 0)) {
    __assert_fail("called_int",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x3b,"void tst_signal_basic()");
  }
  if (((cfunc_int_called & 1U) == 0) && ((cfunc_int_called & 1U) == 0)) {
    __assert_fail("cfunc_int_called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x3c,"void tst_signal_basic()");
  }
  if (intLambda.m_handler._M_invoker._4_4_ != 0x2a) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,intLambda.m_handler._M_invoker._4_4_);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (intLambda.m_handler._M_invoker._4_4_ != 0x2a) {
      __assert_fail("(emitted_int) == (42)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x3d,"void tst_signal_basic()");
    }
  }
  if (cfuncvalue_int != 0x2a) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,cfuncvalue_int);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (cfuncvalue_int != 0x2a) {
      __assert_fail("(cfuncvalue_int) == (42)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x3e,"void tst_signal_basic()");
    }
  }
  std::__cxx11::string::string((string *)&emitted_float2);
  stringFloatFloatLambda.m_handler._M_invoker._4_4_ = 0.0;
  stringFloatFloatLambda.m_handler._M_invoker._0_4_ = 0.0;
  p_Var3 = (_Invoker_type)((long)&emitter.m_buckets + 5);
  stringFloatFloatCFunc.m_handler._M_invoker = p_Var3;
  std::function<void(std::__cxx11::string,float,float)>::function<tst_signal_basic()::__2,void>
            ((function<void(std::__cxx11::string,float,float)> *)&local_1f0,
             (anon_class_32_4_2c966353 *)&stringFloatFloatCFunc.m_handler._M_invoker);
  __len = (socklen_t)p_Var3;
  rengine::
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::SignalHandler_Function
            ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
              *)local_1d0,&local_1f0);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
  ::~function(&local_1f0);
  std::function<void(std::__cxx11::string,float,float)>::
  function<void(&)(std::__cxx11::string,float,float),void>
            ((function<void(std::__cxx11::string,float,float)> *)&signal_string_float_float,
             cfunc_string_float_float);
  rengine::
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::SignalHandler_Function
            ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
              *)local_238,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
              *)&signal_string_float_float);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
  ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float)>
               *)&signal_string_float_float);
  rengine::
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::Signal(&local_260);
  rengine::
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::connect(&local_260,(int)&voidLambda + 0x20,(sockaddr *)local_1d0,__len);
  rengine::
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::connect(&local_260,(int)&voidLambda + 0x20,(sockaddr *)local_238,__len);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"one",&local_281);
  rengine::
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::emit(&local_260,(SignalEmitter *)&voidLambda.m_handler._M_invoker,
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,2.0,3.0);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  if (((emitter.m_buckets._5_1_ & 1) == 0) && ((emitter.m_buckets._5_1_ & 1) == 0)) {
    __assert_fail("called_string_float_float",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x4e,"void tst_signal_basic()");
  }
  if (((cfunc_string_float_float_called & 1U) == 0) && ((cfunc_string_float_float_called & 1U) == 0)
     ) {
    __assert_fail("cfunc_string_float_float_called",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                  ,0x4f,"void tst_signal_basic()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"one",&local_2a9);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &emitted_float2,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2a8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = std::operator<<(poVar2,(string *)&emitted_float2);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"one",&local_2d1);
    poVar2 = std::operator<<(poVar2,local_2d0);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"one",&local_2f9);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &emitted_float2,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2f8);
    if (!_Var1) {
      __assert_fail("(emitted_string) == (std::string(\"one\"))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x50,"void tst_signal_basic()");
    }
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  }
  if ((stringFloatFloatLambda.m_handler._M_invoker._4_4_ != 2.0) ||
     (NAN(stringFloatFloatLambda.m_handler._M_invoker._4_4_))) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,stringFloatFloatLambda.m_handler._M_invoker._4_4_);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,2.0);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((stringFloatFloatLambda.m_handler._M_invoker._4_4_ != 2.0) ||
       (NAN(stringFloatFloatLambda.m_handler._M_invoker._4_4_))) {
      __assert_fail("(emitted_float1) == (2.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x51,"void tst_signal_basic()");
    }
  }
  if ((stringFloatFloatLambda.m_handler._M_invoker._0_4_ != 3.0) ||
     (NAN(stringFloatFloatLambda.m_handler._M_invoker._0_4_))) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,stringFloatFloatLambda.m_handler._M_invoker._0_4_);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3.0);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((stringFloatFloatLambda.m_handler._M_invoker._0_4_ != 3.0) ||
       (NAN(stringFloatFloatLambda.m_handler._M_invoker._0_4_))) {
      __assert_fail("(emitted_float2) == (3.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x52,"void tst_signal_basic()");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"one",&local_321);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          cfuncvalue_string_abi_cxx11_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_320);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = std::operator<<(poVar2,(string *)cfuncvalue_string_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,"one",&local_349);
    poVar2 = std::operator<<(poVar2,local_348);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_370,"one",&local_371);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            cfuncvalue_string_abi_cxx11_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_370);
    if (!_Var1) {
      __assert_fail("(cfuncvalue_string) == (std::string(\"one\"))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x53,"void tst_signal_basic()");
    }
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
  }
  if ((cfuncvalue_float1 != 2.0) || (NAN(cfuncvalue_float1))) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,cfuncvalue_float1);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,2.0);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((cfuncvalue_float1 != 2.0) || (NAN(cfuncvalue_float1))) {
      __assert_fail("(cfuncvalue_float1) == (2.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x54,"void tst_signal_basic()");
    }
  }
  if ((cfuncvalue_float2 != 3.0) || (NAN(cfuncvalue_float2))) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,cfuncvalue_float2);
    poVar2 = std::operator<<(poVar2,"\' vs \'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3.0);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((cfuncvalue_float2 != 3.0) || (NAN(cfuncvalue_float2))) {
      __assert_fail("(cfuncvalue_float2) == (3.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x55,"void tst_signal_basic()");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"void tst_signal_basic()");
  poVar2 = std::operator<<(poVar2,": ok");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  rengine::
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::~Signal(&local_260);
  rengine::
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::~SignalHandler_Function
            ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
              *)local_238);
  rengine::
  SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
  ::~SignalHandler_Function
            ((SignalHandler_Function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_float>
              *)local_1d0);
  std::__cxx11::string::~string((string *)&emitted_float2);
  rengine::Signal<int>::~Signal(&local_180);
  rengine::SignalHandler_Function<int>::~SignalHandler_Function
            ((SignalHandler_Function<int> *)local_158);
  rengine::SignalHandler_Function<int>::~SignalHandler_Function
            ((SignalHandler_Function<int> *)local_100);
  rengine::Signal<>::~Signal((Signal<> *)&stack0xffffffffffffff30);
  rengine::SignalHandler_Function<>::~SignalHandler_Function((SignalHandler_Function<> *)local_a8);
  rengine::SignalHandler_Function<>::~SignalHandler_Function((SignalHandler_Function<> *)local_48);
  rengine::SignalEmitter::~SignalEmitter((SignalEmitter *)&voidLambda.m_handler._M_invoker);
  return;
}

Assistant:

void tst_signal_basic()
{
    bool called_void = false;
    bool called_int = false;
    bool called_string_float_float = false;

    SignalEmitter emitter;

    SignalHandler_Function<> voidLambda([&]() { called_void = true; });
    SignalHandler_Function<> voidCFunc(cfunc_void);

    Signal<> signal_void;
    signal_void.connect(&emitter, &voidLambda);
    signal_void.connect(&emitter, &voidCFunc);
    signal_void.emit(&emitter);
    check_true(cfunc_void_called);
    check_true(called_void);
    signal_void.disconnect(&emitter, &voidCFunc);
    signal_void.disconnect(&emitter, &voidLambda);

    int emitted_int = 0;
    SignalHandler_Function<int> intLambda([&] (int value) {
        called_int = true;
        emitted_int = value;
    });
    SignalHandler_Function<int> intCFunc(cfunc_int);
    Signal<int> signal_int;
    signal_int.connect(&emitter, &intLambda);
    signal_int.connect(&emitter, &intCFunc);
    signal_int.emit(&emitter, 42);
    check_true(called_int);
    check_true(cfunc_int_called);
    check_equal(emitted_int, 42);
    check_equal(cfuncvalue_int, 42);

    std::string emitted_string;
    float emitted_float1 = 0;
    float emitted_float2 = 0;
    SignalHandler_Function<std::string, float, float> stringFloatFloatLambda([&](std::string str, float a, float b) {
        called_string_float_float = true;
        emitted_string = str;
        emitted_float1 = a;
        emitted_float2 = b;
    });
    SignalHandler_Function<std::string, float, float> stringFloatFloatCFunc(cfunc_string_float_float);
    Signal<std::string, float, float> signal_string_float_float;
    signal_string_float_float.connect(&emitter, &stringFloatFloatLambda);
    signal_string_float_float.connect(&emitter, &stringFloatFloatCFunc);
    signal_string_float_float.emit(&emitter, std::string("one"), 2.0f, 3.0f);
    check_true(called_string_float_float);
    check_true(cfunc_string_float_float_called);
    check_equal(emitted_string, std::string("one"));
    check_equal(emitted_float1, 2.0f);
    check_equal(emitted_float2, 3.0f);
    check_equal(cfuncvalue_string, std::string("one"));
    check_equal(cfuncvalue_float1, 2.0f);
    check_equal(cfuncvalue_float2, 3.0f);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}